

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::radial::u2_to_h2_std(radial *this,vec2 *u,vec3 *wi)

{
  float_t fVar1;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  
  fVar1 = wi->z;
  fVar2 = wi->x * wi->x + wi->y * wi->y;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar4 = fVar2;
  (*(this->super_microfacet).super_brdf._vptr_brdf[0x10])((ulong)(uint)fVar1,this,u);
  uVar3 = extraout_XMM0_Qa;
  if (0.0 < fVar2) {
    fVar6 = wi->x * (1.0 / fVar2);
    fVar5 = (1.0 / fVar2) * wi->y;
    fVar2 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
    uVar3 = CONCAT44(fVar5 * (float)extraout_XMM0_Qa + fVar2 * fVar6,
                     fVar6 * (float)extraout_XMM0_Qa - fVar2 * fVar5);
  }
  vVar7.z = fVar4;
  vVar7.x = (float_t)(int)uVar3;
  vVar7.y = (float_t)(int)((ulong)uVar3 >> 0x20);
  return vVar7;
}

Assistant:

vec3 radial::u2_to_h2_std(const vec2 &u, const vec3 &wi) const
{
	float_t zi = wi.z;
	float_t z_i = sqrt(wi.x * wi.x + wi.y * wi.y);
	vec3 wm = u2_to_h2_std_radial(u, zi, z_i);

	// rotate for non-normal incidence
	if (z_i > 0) {
		float_t nrm = 1 / z_i;
		float_t c = wi.x * nrm;
		float_t s = wi.y * nrm;
		float_t x = c * wm.x - s * wm.y;
		float_t y = s * wm.x + c * wm.y;

		wm = vec3(x, y, wm.z);
	}

	return wm;
}